

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataCommon.cpp
# Opt level: O3

void DATA_CONVERSION::ConvertSamplesToSpikeTrains
               (vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                *samples,
               vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
               *spikeTrains,float inputSimulationTime,default_random_engine *generator)

{
  float *pfVar1;
  pointer pfVar2;
  pointer pfVar3;
  pointer pfVar4;
  iterator __position;
  void *pvVar5;
  pointer pvVar6;
  pointer pvVar7;
  ulong uVar8;
  pointer pvVar9;
  _Adaptor<std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>,_float>
  __aurng;
  size_type __new_size;
  vector<float,_std::allocator<float>_> *this;
  size_type __new_size_00;
  long lVar10;
  long lVar11;
  int iVar12;
  ulong uVar13;
  bool bVar14;
  float fVar15;
  vector<float,_std::allocator<float>_> maxValues;
  vector<float,_std::allocator<float>_> minValues;
  value_type_conflict1 local_98;
  allocator_type local_91;
  float local_90;
  float local_8c;
  long local_88;
  vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
  *local_80;
  float local_78;
  float local_74;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  *local_70;
  vector<float,_std::allocator<float>_> local_68;
  vector<float,_std::allocator<float>_> local_50;
  long local_38;
  
  pvVar6 = (samples->
           super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (pvVar6 != (samples->
                super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
    local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start._0_4_ = 0;
    local_90 = inputSimulationTime;
    local_80 = spikeTrains;
    std::vector<float,_std::allocator<float>_>::vector
              (&local_50,
               (long)(pvVar6->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(pvVar6->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                     super__Vector_impl_data._M_start >> 2,(value_type_conflict1 *)&local_68,
               (allocator_type *)&local_98);
    pvVar6 = (samples->
             super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    local_98 = 0.0;
    std::vector<float,_std::allocator<float>_>::vector
              (&local_68,
               (long)*(pointer *)
                      ((long)&(pvVar6->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                              super__Vector_impl_data + 8) -
               *(long *)&(pvVar6->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                         super__Vector_impl_data >> 2,&local_98,&local_91);
    pvVar6 = (samples->
             super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pfVar2 = (pvVar6->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pfVar3 = (pvVar6->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    __new_size = (long)pfVar3 - (long)pfVar2 >> 2;
    if (pfVar3 != pfVar2) {
      lVar10 = 0;
      do {
        fVar15 = pfVar2[lVar10];
        local_50.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start[lVar10] = fVar15;
        *(float *)(CONCAT44(local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start._4_4_,
                            local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start._0_4_) + lVar10 * 4) = fVar15;
        lVar10 = lVar10 + 1;
      } while (__new_size + (__new_size == 0) != lVar10);
    }
    pvVar7 = (samples->
             super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    __new_size_00 = ((long)pvVar7 - (long)pvVar6 >> 3) * -0x5555555555555555;
    if (pvVar7 != pvVar6) {
      lVar10 = 0;
      do {
        if (pfVar3 != pfVar2) {
          pfVar4 = pvVar6[lVar10].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start;
          lVar11 = 0;
          do {
            fVar15 = pfVar4[lVar11];
            if (fVar15 < local_50.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar11]) {
              local_50.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start[lVar11] = fVar15;
              fVar15 = pfVar4[lVar11];
            }
            pfVar1 = (float *)(CONCAT44(local_68.super__Vector_base<float,_std::allocator<float>_>.
                                        _M_impl.super__Vector_impl_data._M_start._4_4_,
                                        local_68.super__Vector_base<float,_std::allocator<float>_>.
                                        _M_impl.super__Vector_impl_data._M_start._0_4_) + lVar11 * 4
                              );
            if (*pfVar1 <= fVar15 && fVar15 != *pfVar1) {
              *(float *)(CONCAT44(local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl
                                  .super__Vector_impl_data._M_start._4_4_,
                                  local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl
                                  .super__Vector_impl_data._M_start._0_4_) + lVar11 * 4) = fVar15;
            }
            lVar11 = lVar11 + 1;
          } while (__new_size + (__new_size == 0) != lVar11);
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 != __new_size_00 + (__new_size_00 == 0));
    }
    std::
    vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
    ::resize(local_80,__new_size_00);
    pvVar6 = (samples->
             super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pvVar7 = (samples->
             super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    local_70 = samples;
    if (pvVar7 != pvVar6) {
      lVar10 = 0;
      uVar13 = 0;
      do {
        std::
        vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
        ::resize((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                  *)(*(long *)local_80 + lVar10),__new_size);
        uVar13 = uVar13 + 1;
        pvVar6 = (local_70->
                 super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        pvVar7 = (local_70->
                 super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        uVar8 = ((long)pvVar7 - (long)pvVar6 >> 3) * -0x5555555555555555;
        lVar10 = lVar10 + 0x18;
      } while (uVar13 <= uVar8 && uVar8 - uVar13 != 0);
    }
    if (pfVar3 != pfVar2) {
      local_38 = __new_size + (__new_size == 0);
      local_88 = 0;
      pvVar9 = pvVar7;
      do {
        bVar14 = pvVar9 != pvVar6;
        pvVar9 = pvVar6;
        if (bVar14) {
          local_78 = *(float *)(CONCAT44(local_68.super__Vector_base<float,_std::allocator<float>_>.
                                         _M_impl.super__Vector_impl_data._M_start._4_4_,
                                         local_68.super__Vector_base<float,_std::allocator<float>_>.
                                         _M_impl.super__Vector_impl_data._M_start._0_4_) +
                               local_88 * 4) -
                     local_50.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start[local_88];
          lVar10 = local_88 * 0x18;
          uVar13 = 0;
          do {
            if (0.0 < local_90) {
              local_74 = (pvVar6[uVar13].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start[local_88] -
                         local_50.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start[local_88]) / local_78;
              local_8c = 0.0;
              iVar12 = 1;
              do {
                fVar15 = std::
                         generate_canonical<float,24ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                                   (generator);
                if (fVar15 < local_74) {
                  this = (vector<float,_std::allocator<float>_> *)
                         (*(long *)(*(long *)local_80 + uVar13 * 0x18) + lVar10);
                  fVar15 = std::
                           generate_canonical<float,24ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                                     (generator);
                  local_98 = local_8c + fVar15 * 1e-06 + 0.0;
                  __position._M_current =
                       (this->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                       super__Vector_impl_data._M_finish;
                  if (__position._M_current ==
                      (this->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                      super__Vector_impl_data._M_end_of_storage) {
                    std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                              (this,__position,&local_98);
                  }
                  else {
                    *__position._M_current = local_98;
                    (this->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                    super__Vector_impl_data._M_finish = __position._M_current + 1;
                  }
                }
                local_8c = (float)iVar12;
                iVar12 = iVar12 + 1;
              } while (local_8c < local_90);
              pvVar6 = (local_70->
                       super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              pvVar7 = (local_70->
                       super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
            }
            uVar13 = uVar13 + 1;
            uVar8 = ((long)pvVar7 - (long)pvVar6 >> 3) * -0x5555555555555555;
            pvVar9 = pvVar7;
          } while (uVar13 <= uVar8 && uVar8 - uVar13 != 0);
        }
        local_88 = local_88 + 1;
      } while (local_88 != local_38);
    }
    pvVar5 = (void *)CONCAT44(local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start._4_4_,
                              local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start._0_4_);
    if (pvVar5 != (void *)0x0) {
      operator_delete(pvVar5,(long)local_68.super__Vector_base<float,_std::allocator<float>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar5)
      ;
    }
    if (local_50.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_50.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_50.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_50.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void DATA_CONVERSION::ConvertSamplesToSpikeTrains(
        std::vector<SPIKING_NN::Sample> &samples,
        std::vector<SPIKING_NN::SpikeTrain> &spikeTrains,
        float inputSimulationTime,
        std::default_random_engine &generator )
{
    if ( samples.empty()) {
        return;
    }

    std::vector<float> minValues( samples[0].size(), 0 );
    std::vector<float> maxValues( samples[0].size(), 0 );
    for ( auto activationId = 0; activationId < samples[0].size(); ++activationId ) {
        minValues[activationId] = samples[0][activationId];
        maxValues[activationId] = samples[0][activationId];
    }

    for ( auto sampleId = 0; sampleId < samples.size(); ++sampleId ) {
        for ( auto activationId = 0; activationId < samples[0].size(); ++activationId ) {
            if ( samples[sampleId][activationId] < minValues[activationId] ) {
                minValues[activationId] = samples[sampleId][activationId];
            }
            if ( samples[sampleId][activationId] > maxValues[activationId] ) {
                maxValues[activationId] = samples[sampleId][activationId];
            }
        }
    }

    // We are not checking maxValues[idx] == minValues[idx] because such params are redundant in dataset
    std::uniform_real_distribution<float> distribution( 0, 1 );
    std::uniform_real_distribution<float> timeNoiseDistribution( 0, SPIKING_NN::TIME_STEP / 1e4f );
    size_t inputSize = samples[0].size();
    spikeTrains.resize( samples.size());
    for ( int idx = 0; idx < samples.size(); ++idx ) {
        spikeTrains[idx].resize( inputSize );
    }
    for ( auto activationId = 0; activationId < inputSize; ++activationId ) {
        float maxDelta = ( maxValues[activationId] - minValues[activationId] );
        for ( int sid = 0; sid < samples.size(); ++sid ) {
            float &activation = samples[sid][activationId];
            float intensity = ( activation - minValues[activationId] ) / maxDelta;
            for ( int t = 0; t < inputSimulationTime; ++t ) {
                if ( distribution( generator ) < intensity ) {
                    spikeTrains[sid][activationId].emplace_back((float) t + timeNoiseDistribution( generator ));
                }
            }
        }
    }
}